

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgExpression.cpp
# Opt level: O3

ExpressionSpec *
rsg::anon_unknown_0::chooseExpression
          (GeneratorState *state,ExpressionSpec *specs,int numSpecs,ConstValueRangeAccess valueRange
          )

{
  int iVar1;
  ulong uVar2;
  ExpressionSpec *pEVar3;
  long lVar4;
  ExpressionSpec *pEVar5;
  bool bVar6;
  undefined4 uVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float weights [30];
  float afStack_a8 [30];
  
  uVar2 = (ulong)(uint)numSpecs;
  if (0 < numSpecs) {
    lVar4 = 0;
    do {
      uVar7 = (**(code **)((long)&specs->getWeight + lVar4 * 4))(state);
      *(undefined4 *)((long)afStack_a8 + lVar4) = uVar7;
      lVar4 = lVar4 + 4;
    } while (uVar2 * 4 - lVar4 != 0);
  }
  pEVar5 = specs + uVar2;
  if (numSpecs == 0) {
    deRandom_getFloat(&state->m_random->m_rnd);
  }
  else {
    fVar8 = 0.0;
    lVar4 = 0;
    iVar1 = 1;
    do {
      fVar8 = fVar8 + afStack_a8[lVar4];
      lVar4 = (long)iVar1;
      bVar6 = iVar1 != numSpecs;
      iVar1 = iVar1 + 1;
    } while (bVar6);
    fVar9 = deRandom_getFloat(&state->m_random->m_rnd);
    iVar1 = 1;
    lVar4 = 0;
    fVar10 = 0.0;
    pEVar3 = specs;
    do {
      fVar10 = fVar10 + afStack_a8[lVar4];
      if (fVar8 * fVar9 + 0.0 < fVar10) {
        return pEVar3;
      }
      if (0.0 < afStack_a8[lVar4]) {
        pEVar5 = pEVar3;
      }
      lVar4 = (long)iVar1;
      pEVar3 = specs + lVar4;
      iVar1 = iVar1 + 1;
    } while (lVar4 * 0x10 != uVar2 * 0x10);
  }
  return pEVar5;
}

Assistant:

const ExpressionSpec* chooseExpression (GeneratorState& state, const ExpressionSpec* specs, int numSpecs, ConstValueRangeAccess valueRange)
{
	float weights[MAX_EXPRESSION_SPECS];

	DE_ASSERT(numSpecs <= (int)DE_LENGTH_OF_ARRAY(weights));

	// Compute weights
	for (int ndx = 0; ndx < numSpecs; ndx++)
		weights[ndx] = specs[ndx].getWeight(state, valueRange);

	// Choose
	return &state.getRandom().chooseWeighted<const ExpressionSpec&>(specs, specs+numSpecs, weights);
}